

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

void Gudhi::persistence_matrix::swap
               (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
                *swap1,Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
                       *swap2)

{
  pointer puVar1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  _Any_data __tmp;
  
  swap((Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
        *)swap1,(Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
                 *)swap2);
  puVar1 = (swap1->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar4 = (swap2->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (swap1->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (swap1->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (swap1->super_type).pivotToPosition_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (swap2->super_type).pivotToPosition_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  (swap1->super_type).pivotToPosition_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar4;
  (swap1->super_type).pivotToPosition_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (swap2->super_type).pivotToPosition_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (swap2->super_type).pivotToPosition_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar5;
  (swap2->super_type).pivotToPosition_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar6;
  (swap2->super_type).pivotToPosition_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar1;
  uVar7 = *(undefined8 *)&(swap1->birthComp_).super__Function_base._M_functor;
  uVar8 = *(undefined8 *)((long)&(swap1->birthComp_).super__Function_base._M_functor + 8);
  uVar9 = *(undefined8 *)((long)&(swap2->birthComp_).super__Function_base._M_functor + 8);
  *(undefined8 *)&(swap1->birthComp_).super__Function_base._M_functor =
       *(undefined8 *)&(swap2->birthComp_).super__Function_base._M_functor;
  *(undefined8 *)((long)&(swap1->birthComp_).super__Function_base._M_functor + 8) = uVar9;
  *(undefined8 *)&(swap2->birthComp_).super__Function_base._M_functor = uVar7;
  *(undefined8 *)((long)&(swap2->birthComp_).super__Function_base._M_functor + 8) = uVar8;
  p_Var2 = (swap1->birthComp_).super__Function_base._M_manager;
  (swap1->birthComp_).super__Function_base._M_manager =
       (swap2->birthComp_).super__Function_base._M_manager;
  (swap2->birthComp_).super__Function_base._M_manager = p_Var2;
  p_Var3 = (swap1->birthComp_)._M_invoker;
  (swap1->birthComp_)._M_invoker = (swap2->birthComp_)._M_invoker;
  (swap2->birthComp_)._M_invoker = p_Var3;
  uVar7 = *(undefined8 *)&(swap1->deathComp_).super__Function_base._M_functor;
  uVar8 = *(undefined8 *)((long)&(swap1->deathComp_).super__Function_base._M_functor + 8);
  uVar9 = *(undefined8 *)((long)&(swap2->deathComp_).super__Function_base._M_functor + 8);
  *(undefined8 *)&(swap1->deathComp_).super__Function_base._M_functor =
       *(undefined8 *)&(swap2->deathComp_).super__Function_base._M_functor;
  *(undefined8 *)((long)&(swap1->deathComp_).super__Function_base._M_functor + 8) = uVar9;
  *(undefined8 *)&(swap2->deathComp_).super__Function_base._M_functor = uVar7;
  *(undefined8 *)((long)&(swap2->deathComp_).super__Function_base._M_functor + 8) = uVar8;
  p_Var2 = (swap1->deathComp_).super__Function_base._M_manager;
  (swap1->deathComp_).super__Function_base._M_manager =
       (swap2->deathComp_).super__Function_base._M_manager;
  (swap2->deathComp_).super__Function_base._M_manager = p_Var2;
  p_Var3 = (swap1->deathComp_)._M_invoker;
  (swap1->deathComp_)._M_invoker = (swap2->deathComp_)._M_invoker;
  (swap2->deathComp_)._M_invoker = p_Var3;
  return;
}

Assistant:

void swap(Chain_vine_swap& swap1, Chain_vine_swap& swap2) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      swap(static_cast<Chain_barcode_swap<Master_matrix>&>(swap1),
           static_cast<Chain_barcode_swap<Master_matrix>&>(swap2));
    }
    std::swap(swap1.birthComp_, swap2.birthComp_);
    std::swap(swap1.deathComp_, swap2.deathComp_);
  }